

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseRoot(Parser *this,char *source,char **include_paths,char *source_filename)

{
  int *piVar1;
  int iVar2;
  StructDef *this_00;
  Namespace *pNVar3;
  long lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
  *this_01;
  undefined1 this_02 [8];
  EnumDef *__rhs;
  long *plVar7;
  iterator __position;
  iterator __position_00;
  long *plVar8;
  BaseType *pBVar9;
  undefined8 *puVar10;
  string *this_03;
  char *in_R8;
  size_t max_components;
  CheckedError *ce;
  bool bVar11;
  CheckedError err;
  undefined1 local_130 [32];
  Parser *local_110;
  int local_104;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
  *local_100;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  DoParse(this,source,include_paths,source_filename,in_R8);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00115186;
  local_110 = this;
  CheckedError::~CheckedError((CheckedError *)this);
  local_100 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
               *)(source + 0xa8);
  local_f8 = (undefined1  [8])(source + 0xd8);
  __position_00._M_current = *(StructDef ***)(source + 0xd8);
  while (this = local_110, __position_00._M_current != *(StructDef ***)(source + 0xe0)) {
    this_00 = *__position_00._M_current;
    if (this_00->predecl == true) {
      if (source[0x3f9] != '\x01') {
LAB_00114ffc:
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130,"type referenced but not defined (check namespace): ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
        ;
        this = local_110;
        pbVar6 = (this_00->original_location)._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
        if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_f8 + 8),", originally at: ",pbVar6);
          std::__cxx11::string::append((string *)local_130);
          std::__cxx11::string::~string((string *)(local_f8 + 8));
        }
        Error(this,(string *)source);
LAB_0011507f:
        this_03 = (string *)local_130;
LAB_00115181:
        std::__cxx11::string::~string((string *)this_03);
        goto LAB_00115186;
      }
      pNVar3 = (this_00->super_Definition).defined_namespace;
      max_components =
           (long)(pNVar3->components).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pNVar3->components).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
      __rhs = (EnumDef *)0x0;
      while ((this_02 = local_f8, this_01 = local_100, max_components != 0xffffffffffffffff &&
             (__rhs == (EnumDef *)0x0))) {
        Namespace::GetFullyQualifiedName
                  ((string *)local_130,(this_00->super_Definition).defined_namespace,
                   (string *)this_00,max_components);
        __rhs = LookupEnum((Parser *)source,(string *)local_130);
        std::__cxx11::string::~string((string *)local_130);
        max_components = max_components - 1;
      }
      if (__rhs == (EnumDef *)0x0) goto LAB_00114ffc;
      local_104 = (this_00->super_Definition).refcount;
      for (plVar7 = *(long **)local_f8; plVar7 != *(long **)(source + 0xe0); plVar7 = plVar7 + 1) {
        lVar4 = *plVar7;
        for (plVar8 = *(long **)(lVar4 + 0xf8); plVar8 != *(long **)(lVar4 + 0x100);
            plVar8 = plVar8 + 1) {
          lVar5 = *plVar8;
          if (*(StructDef **)(lVar5 + 0xd0) == this_00) {
            *(undefined8 *)(lVar5 + 0xd0) = 0;
            *(EnumDef **)(lVar5 + 0xd8) = __rhs;
            bVar11 = (*(int *)(lVar5 + 200) - 0xeU & 0xfffffffb) == 0;
            pBVar9 = (BaseType *)(lVar5 + 0xcc);
            if (!bVar11) {
              pBVar9 = (BaseType *)(lVar5 + 200);
            }
            if (*(int *)(lVar5 + 200 + (ulong)bVar11 * 4) != 0xf) {
              __assert_fail("bt == BASE_TYPE_STRUCT",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                            ,0xdd3,
                            "CheckedError flatbuffers::Parser::ParseRoot(const char *, const char **, const char *)"
                           );
            }
            *pBVar9 = (__rhs->underlying_type).base_type;
            piVar1 = &(this_00->super_Definition).refcount;
            *piVar1 = *piVar1 + -1;
            piVar1 = &(__rhs->super_Definition).refcount;
            *piVar1 = *piVar1 + 1;
          }
        }
      }
      iVar2 = (this_00->super_Definition).refcount;
      if (iVar2 != 0) {
        NumToString<int>(&local_50,iVar2);
        std::operator+(&local_b0,"internal: ",&local_50);
        std::operator+(&local_90,&local_b0,"/");
        this = local_110;
        NumToString<int>(&local_d0,local_104);
        std::operator+(&local_70,&local_90,&local_d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_f8 + 8),&local_70,
                       " use(s) of pre-declaration enum not accounted for: ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_f8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        Error(this,(string *)source);
        std::__cxx11::string::~string((string *)local_130);
        std::__cxx11::string::~string((string *)(local_f8 + 8));
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        this_03 = &local_50;
        goto LAB_00115181;
      }
      __position = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                           *)local_100,(key_type *)this_00);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
      ::erase_abi_cxx11_(this_01,__position);
      __position_00 =
           std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::erase
                     ((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *
                      )this_02,__position_00._M_current);
      StructDef::~StructDef(this_00);
      operator_delete(this_00,0x148);
    }
    else {
      __position_00._M_current = __position_00._M_current + 1;
    }
  }
  for (plVar7 = *(long **)(source + 0x120); plVar7 != *(long **)(source + 0x128);
      plVar7 = plVar7 + 1) {
    lVar4 = *plVar7;
    if (*(char *)(lVar4 + 200) == '\x01') {
      for (puVar10 = *(undefined8 **)(lVar4 + 0x120); puVar10 != *(undefined8 **)(lVar4 + 0x128);
          puVar10 = puVar10 + 1) {
        if ((*(ulong *)(source + 0x680) & 0xfffffffffff47c34) != 0 ||
            *(ulong *)(source + 0x680) == 0) {
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar10;
          iVar2 = *(int *)((long)&pbVar6[1].field_2 + 8);
          if (iVar2 == 0xf) {
            if (pbVar6[2]._M_dataplus._M_p[0x110] == '\x01') goto LAB_0011505d;
          }
          else if (iVar2 == 0xd) {
LAB_0011505d:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_130,"only tables can be union elements in the generated language: "
                           ,pbVar6);
            Error(this,(string *)source);
            goto LAB_0011507f;
          }
        }
      }
    }
  }
  CheckPrivateLeak((Parser *)local_130);
  local_130[1] = true;
  if (local_130[0] == (string)0x1) {
    *(undefined1 *)&(this->super_ParserState).prev_cursor_ = 1;
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 0;
    local_130[1] = true;
  }
  else {
    if (*(int *)(source + 0x1c) == 0x7b) {
      DoParseJson(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001151ee;
      CheckedError::~CheckedError((CheckedError *)this);
    }
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_001151ee:
  CheckedError::~CheckedError((CheckedError *)local_130);
LAB_00115186:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseRoot(const char *source, const char **include_paths,
                               const char *source_filename) {
  ECHECK(DoParse(source, include_paths, source_filename, nullptr));

  // Check that all types were defined.
  for (auto it = structs_.vec.begin(); it != structs_.vec.end();) {
    auto &struct_def = **it;
    if (struct_def.predecl) {
      if (opts.proto_mode) {
        // Protos allow enums to be used before declaration, so check if that
        // is the case here.
        EnumDef *enum_def = nullptr;
        for (size_t components =
                 struct_def.defined_namespace->components.size() + 1;
             components && !enum_def; components--) {
          auto qualified_name =
              struct_def.defined_namespace->GetFullyQualifiedName(
                  struct_def.name, components - 1);
          enum_def = LookupEnum(qualified_name);
        }
        if (enum_def) {
          // This is pretty slow, but a simple solution for now.
          auto initial_count = struct_def.refcount;
          for (auto struct_it = structs_.vec.begin();
               struct_it != structs_.vec.end(); ++struct_it) {
            auto &sd = **struct_it;
            for (auto field_it = sd.fields.vec.begin();
                 field_it != sd.fields.vec.end(); ++field_it) {
              auto &field = **field_it;
              if (field.value.type.struct_def == &struct_def) {
                field.value.type.struct_def = nullptr;
                field.value.type.enum_def = enum_def;
                auto &bt = IsVector(field.value.type)
                               ? field.value.type.element
                               : field.value.type.base_type;
                FLATBUFFERS_ASSERT(bt == BASE_TYPE_STRUCT);
                bt = enum_def->underlying_type.base_type;
                struct_def.refcount--;
                enum_def->refcount++;
              }
            }
          }
          if (struct_def.refcount)
            return Error("internal: " + NumToString(struct_def.refcount) + "/" +
                         NumToString(initial_count) +
                         " use(s) of pre-declaration enum not accounted for: " +
                         enum_def->name);
          structs_.dict.erase(structs_.dict.find(struct_def.name));
          it = structs_.vec.erase(it);
          delete &struct_def;
          continue;  // Skip error.
        }
      }
      auto err = "type referenced but not defined (check namespace): " +
                 struct_def.name;
      if (struct_def.original_location)
        err += ", originally at: " + *struct_def.original_location;
      return Error(err);
    }
    ++it;
  }

  // This check has to happen here and not earlier, because only now do we
  // know for sure what the type of these are.
  for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
    auto &enum_def = **it;
    if (enum_def.is_union) {
      for (auto val_it = enum_def.Vals().begin();
           val_it != enum_def.Vals().end(); ++val_it) {
        auto &val = **val_it;

        if (!(opts.lang_to_generate != 0 && SupportsAdvancedUnionFeatures()) &&
            (IsStruct(val.union_type) || IsString(val.union_type)))

          return Error(
              "only tables can be union elements in the generated language: " +
              val.name);
      }
    }
  }

  auto err = CheckPrivateLeak();
  if (err.Check()) return err;

  // Parse JSON object only if the scheme has been parsed.
  if (token_ == '{') { ECHECK(DoParseJson()); }
  return NoError();
}